

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFFormFieldObjectHelper.cc
# Opt level: O0

void __thiscall anon_unknown.dwarf_1f2898::TfFinder::TfFinder(TfFinder *this)

{
  TfFinder *this_local;
  
  QPDFObjectHandle::TokenFilter::TokenFilter(&this->super_TokenFilter);
  (this->super_TokenFilter)._vptr_TokenFilter = (_func_int **)&PTR__TfFinder_0058d5f8;
  this->tf = 11.0;
  this->tf_idx = -1;
  std::__cxx11::string::string((string *)&this->font_name);
  this->last_num = 0.0;
  this->last_num_idx = -1;
  std::__cxx11::string::string((string *)&this->last_name);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->DA);
  return;
}

Assistant:

TfFinder() = default;